

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_4::Repairer::ArchiveFile(Repairer *this,string *fname)

{
  Logger *info_log;
  char *__s;
  ulong uVar1;
  Status *this_00;
  undefined8 uVar2;
  undefined8 in_RSI;
  long in_RDI;
  Status s;
  string new_file;
  string new_dir;
  char *slash;
  Status *in_stack_ffffffffffffff50;
  string local_88 [32];
  undefined1 local_68 [8];
  string local_60 [8];
  Status *in_stack_ffffffffffffffa8;
  undefined1 local_40 [8];
  string local_38 [32];
  char *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  __s = (char *)std::__cxx11::string::c_str();
  local_18 = strrchr(__s,0x2f);
  std::__cxx11::string::string(local_38);
  if (local_18 != (char *)0x0) {
    uVar1 = std::__cxx11::string::data();
    std::__cxx11::string::data();
    std::__cxx11::string::assign((char *)local_38,uVar1);
  }
  std::__cxx11::string::append((char *)local_38);
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x48))(local_40,*(long **)(in_RDI + 0x20),local_38);
  Status::~Status(in_stack_ffffffffffffff50);
  std::__cxx11::string::string(local_60,local_38);
  std::__cxx11::string::append((char *)local_60);
  if (local_18 == (char *)0x0) {
    std::__cxx11::string::c_str();
  }
  std::__cxx11::string::append((char *)local_60);
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x60))
            (local_68,*(long **)(in_RDI + 0x20),local_10,local_60);
  info_log = *(Logger **)(in_RDI + 0x60);
  this_00 = (Status *)std::__cxx11::string::c_str();
  Status::ToString_abi_cxx11_(in_stack_ffffffffffffffa8);
  uVar2 = std::__cxx11::string::c_str();
  Log(info_log,"Archiving %s: %s\n",this_00,uVar2);
  std::__cxx11::string::~string(local_88);
  Status::~Status(this_00);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ArchiveFile(const std::string& fname) {
    // Move into another directory.  E.g., for
    //    dir/foo
    // rename to
    //    dir/lost/foo
    const char* slash = strrchr(fname.c_str(), '/');
    std::string new_dir;
    if (slash != nullptr) {
      new_dir.assign(fname.data(), slash - fname.data());
    }
    new_dir.append("/lost");
    env_->CreateDir(new_dir);  // Ignore error
    std::string new_file = new_dir;
    new_file.append("/");
    new_file.append((slash == nullptr) ? fname.c_str() : slash + 1);
    Status s = env_->RenameFile(fname, new_file);
    Log(options_.info_log, "Archiving %s: %s\n", fname.c_str(),
        s.ToString().c_str());
  }